

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask20_16(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 0x14 | *out;
  puVar1 = out + 1;
  *puVar1 = in[1] >> 0xc;
  *puVar1 = in[2] << 8 | *puVar1;
  *puVar1 = in[3] << 0x1c | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[3] >> 4;
  *puVar1 = in[4] << 0x10 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[4] >> 0x10;
  *puVar1 = in[5] << 4 | *puVar1;
  *puVar1 = in[6] << 0x18 | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[6] >> 8;
  *puVar1 = in[7] << 0xc | *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[8];
  *puVar1 = in[9] << 0x14 | *puVar1;
  puVar1 = out + 6;
  *puVar1 = in[9] >> 0xc;
  *puVar1 = in[10] << 8 | *puVar1;
  *puVar1 = in[0xb] << 0x1c | *puVar1;
  puVar1 = out + 7;
  *puVar1 = in[0xb] >> 4;
  *puVar1 = in[0xc] << 0x10 | *puVar1;
  puVar1 = out + 8;
  *puVar1 = in[0xc] >> 0x10;
  *puVar1 = in[0xd] << 4 | *puVar1;
  *puVar1 = in[0xe] << 0x18 | *puVar1;
  puVar1 = out + 9;
  *puVar1 = in[0xe] >> 8;
  *puVar1 = in[0xf] << 0xc | *puVar1;
  return out + 10;
}

Assistant:

uint32_t *__fastpackwithoutmask20_16(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (20 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (20 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (20 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (20 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (20 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (20 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (20 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (20 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  ++in;

  return out;
}